

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O3

bool woff2::ReadFont(uint8_t *data,size_t len,Font *font)

{
  uint uVar1;
  bool bVar2;
  Buffer local_18;
  
  if (3 < len) {
    uVar1 = *(uint *)data;
    font->flavor = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    local_18.offset_ = 4;
    if (uVar1 != 0x66637474) {
      local_18.buffer_ = data;
      local_18.length_ = len;
      bVar2 = ReadTrueTypeFont(&local_18,data,len,font);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ReadFont(const uint8_t* data, size_t len, Font* font) {
  Buffer file(data, len);

  if (!file.ReadU32(&font->flavor)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (font->flavor == kTtcFontFlavor) {
    return FONT_COMPRESSION_FAILURE();
  }
  return ReadTrueTypeFont(&file, data, len, font);
}